

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_spirv_c.cpp
# Opt level: O3

dxil_spv_result dxil_spv_converter_run(dxil_spv_converter converter)

{
  LocalRootParameterType LVar1;
  pointer puVar2;
  pointer pLVar3;
  dxil_spv_converter pdVar4;
  bool bVar5;
  uint32_t uVar6;
  LoggingCallback p_Var7;
  void *pvVar8;
  String *__str;
  unique_ptr<dxil_spv::OptionBase,_std::default_delete<dxil_spv::OptionBase>_> *opt;
  pointer puVar9;
  pointer pLVar10;
  pointer pFVar11;
  dxil_spv_result dVar12;
  Converter dxil_converter;
  SPIRVModule module;
  uint32_t driver_version;
  uint32_t driver_id;
  ConvertedFunction entry_point;
  char buffer [4096];
  Converter local_10a0;
  SPIRVModule local_1098;
  uint32_t local_1090;
  uint32_t local_108c;
  dxil_spv_converter local_1088;
  ConvertedFunction local_1080;
  vector<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
  local_1050;
  undefined1 local_1038 [32];
  pointer local_1018;
  pointer local_1000;
  pointer local_fe8;
  _Hashtable<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_fc8;
  _Hashtable<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_f90;
  pointer local_f58;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::CFGNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_f40 [68];
  
  dxil_spv::SPIRVModule::SPIRVModule(&local_1098);
  dxil_spv::Converter::Converter
            (&local_10a0,converter->bc_parser,converter->bc_reflection_parser,&local_1098);
  if ((converter->entry_point)._M_string_length != 0) {
    dxil_spv::Converter::set_entry_point(&local_10a0,(converter->entry_point)._M_dataplus._M_p);
  }
  dxil_spv::Converter::set_resource_remapping_interface
            (&local_10a0,&(converter->remapper).super_ResourceRemappingInterface);
  puVar9 = (converter->options).
           super__Vector_base<std::unique_ptr<dxil_spv::OptionBase,_std::default_delete<dxil_spv::OptionBase>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,_std::default_delete<dxil_spv::OptionBase>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (converter->options).
           super__Vector_base<std::unique_ptr<dxil_spv::OptionBase,_std::default_delete<dxil_spv::OptionBase>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,_std::default_delete<dxil_spv::OptionBase>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar9 != puVar2) {
    do {
      dxil_spv::Converter::add_option
                (&local_10a0,
                 (puVar9->_M_t).
                 super___uniq_ptr_impl<dxil_spv::OptionBase,_std::default_delete<dxil_spv::OptionBase>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_dxil_spv::OptionBase_*,_std::default_delete<dxil_spv::OptionBase>_>
                 .super__Head_base<0UL,_dxil_spv::OptionBase_*,_false>._M_head_impl);
      puVar9 = puVar9 + 1;
    } while (puVar9 != puVar2);
  }
  pLVar10 = (converter->local_root_parameters).
            super__Vector_base<LocalRootParameter,_dxil_spv::ThreadLocalAllocator<LocalRootParameter>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pLVar3 = (converter->local_root_parameters).
           super__Vector_base<LocalRootParameter,_dxil_spv::ThreadLocalAllocator<LocalRootParameter>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pLVar10 != pLVar3) {
    do {
      LVar1 = pLVar10->type;
      if (LVar1 == Table) {
        std::
        vector<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
        ::vector(&local_1050,&pLVar10->table_entries);
        dxil_spv::Converter::add_local_root_descriptor_table(&local_10a0,&local_1050);
        if (local_1050.
            super__Vector_base<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          dxil_spv::free_in_thread
                    (local_1050.
                     super__Vector_base<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      else if (LVar1 == Descriptor) {
        dxil_spv::Converter::add_local_root_descriptor
                  (&local_10a0,(pLVar10->local_descriptor).resource_class,
                   (pLVar10->local_descriptor).register_space,
                   (pLVar10->local_descriptor).register_index);
      }
      else if (LVar1 == Constants) {
        dxil_spv::Converter::add_local_root_constants
                  (&local_10a0,(pLVar10->local_constants).register_space,
                   (pLVar10->local_constants).register_index,(pLVar10->local_constants).num_words);
      }
      pLVar10 = pLVar10 + 1;
    } while (pLVar10 != pLVar3);
  }
  dxil_spv::Converter::convert_entry_point(&local_1080,&local_10a0);
  if (local_1080.entry.entry == (CFGNode *)0x0) {
    p_Var7 = dxil_spv::get_thread_log_callback();
    if (p_Var7 == (LoggingCallback)0x0) {
      dxil_spv_converter_run_cold_3();
    }
    else {
      local_1038._16_4_ = 0x75662074;
      local_1038[0x14] = 'n';
      local_1038._21_6_ = 0x2e6e6f697463;
      local_1038[0x1b] = '\n';
      local_1038[0x1c] = '\0';
      local_1038[0] = 'F';
      local_1038[1] = 'a';
      local_1038[2] = 'i';
      local_1038[3] = 'l';
      local_1038[4] = 'e';
      local_1038[5] = 'd';
      local_1038[6] = ' ';
      local_1038[7] = 't';
      local_1038[8] = 'o';
      local_1038[9] = ' ';
      local_1038[10] = 'c';
      local_1038[0xb] = 'o';
      local_1038[0xc] = 'n';
      local_1038[0xd] = 'v';
      local_1038[0xe] = 'e';
      local_1038[0xf] = 'r';
LAB_0010bf58:
      pvVar8 = dxil_spv::get_thread_log_callback_userdata();
      (*p_Var7)(pvVar8,Error,local_1038);
    }
  }
  else {
    dxil_spv::CFGStructurizer::CFGStructurizer
              ((CFGStructurizer *)local_1038,local_1080.entry.entry,
               (CFGNodePool *)
               local_1080.node_pool._M_t.
               super___uniq_ptr_impl<dxil_spv::CFGNodePool,_std::default_delete<dxil_spv::CFGNodePool>_>
               ._M_t.
               super__Tuple_impl<0UL,_dxil_spv::CFGNodePool_*,_std::default_delete<dxil_spv::CFGNodePool>_>
               .super__Head_base<0UL,_dxil_spv::CFGNodePool_*,_false>._M_head_impl,&local_1098);
    bVar5 = dxil_spv::Converter::get_driver_version(&local_10a0,&local_108c,&local_1090);
    if (bVar5) {
      dxil_spv::CFGStructurizer::set_driver_version
                ((CFGStructurizer *)local_1038,local_108c,local_1090);
    }
    dxil_spv::SPIRVModule::set_entry_build_point(&local_1098,local_1080.entry.func);
    dxil_spv::CFGStructurizer::run((CFGStructurizer *)local_1038);
    dxil_spv::SPIRVModule::emit_entry_point_function_body(&local_1098,(CFGStructurizer *)local_1038)
    ;
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::CFGNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(local_f40);
    if (local_f58 != (pointer)0x0) {
      dxil_spv::free_in_thread(local_f58);
    }
    std::
    _Hashtable<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_f90);
    std::
    _Hashtable<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_fc8);
    if (local_fe8 != (pointer)0x0) {
      dxil_spv::free_in_thread(local_fe8);
    }
    local_1088 = converter;
    if (local_1000 != (pointer)0x0) {
      dxil_spv::free_in_thread(local_1000);
    }
    if (local_1018 != (pointer)0x0) {
      dxil_spv::free_in_thread(local_1018);
    }
    if (local_1080.leaf_functions.
        super__Vector_base<dxil_spv::ConvertedFunction::Function,_dxil_spv::ThreadLocalAllocator<dxil_spv::ConvertedFunction::Function>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1080.leaf_functions.
        super__Vector_base<dxil_spv::ConvertedFunction::Function,_dxil_spv::ThreadLocalAllocator<dxil_spv::ConvertedFunction::Function>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pFVar11 = local_1080.leaf_functions.
                super__Vector_base<dxil_spv::ConvertedFunction::Function,_dxil_spv::ThreadLocalAllocator<dxil_spv::ConvertedFunction::Function>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        if (pFVar11->entry == (CFGNode *)0x0) {
          p_Var7 = dxil_spv::get_thread_log_callback();
          if (p_Var7 != (LoggingCallback)0x0) {
            local_1038._16_4_ = 0x6c756e20;
            local_1038[0x14] = 'l';
            local_1038._21_6_ = 0xa21727470;
            local_1038[0] = 'L';
            local_1038[1] = 'e';
            local_1038[2] = 'a';
            local_1038[3] = 'f';
            local_1038[4] = ' ';
            local_1038[5] = 'f';
            local_1038[6] = 'u';
            local_1038[7] = 'n';
            local_1038[8] = 'c';
            local_1038[9] = 't';
            local_1038[10] = 'i';
            local_1038[0xb] = 'o';
            local_1038[0xc] = 'n';
            local_1038[0xd] = ' ';
            local_1038[0xe] = 'i';
            local_1038[0xf] = 's';
            goto LAB_0010bf58;
          }
          dxil_spv_converter_run_cold_1();
          goto LAB_0010bf6e;
        }
        dxil_spv::CFGStructurizer::CFGStructurizer
                  ((CFGStructurizer *)local_1038,pFVar11->entry,
                   (CFGNodePool *)
                   local_1080.node_pool._M_t.
                   super___uniq_ptr_impl<dxil_spv::CFGNodePool,_std::default_delete<dxil_spv::CFGNodePool>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_dxil_spv::CFGNodePool_*,_std::default_delete<dxil_spv::CFGNodePool>_>
                   .super__Head_base<0UL,_dxil_spv::CFGNodePool_*,_false>._M_head_impl,&local_1098);
        dxil_spv::SPIRVModule::set_entry_build_point(&local_1098,pFVar11->func);
        dxil_spv::CFGStructurizer::run((CFGStructurizer *)local_1038);
        dxil_spv::SPIRVModule::emit_leaf_function_body
                  (&local_1098,pFVar11->func,(CFGStructurizer *)local_1038);
        std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::CFGNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(local_f40);
        if (local_f58 != (pointer)0x0) {
          dxil_spv::free_in_thread(local_f58);
        }
        std::
        _Hashtable<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&local_f90);
        std::
        _Hashtable<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&local_fc8);
        if (local_fe8 != (pointer)0x0) {
          dxil_spv::free_in_thread(local_fe8);
        }
        if (local_1000 != (pointer)0x0) {
          dxil_spv::free_in_thread(local_1000);
        }
        if (local_1018 != (pointer)0x0) {
          dxil_spv::free_in_thread(local_1018);
        }
        pFVar11 = pFVar11 + 1;
      } while (pFVar11 !=
               local_1080.leaf_functions.
               super__Vector_base<dxil_spv::ConvertedFunction::Function,_dxil_spv::ThreadLocalAllocator<dxil_spv::ConvertedFunction::Function>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    pdVar4 = local_1088;
    bVar5 = dxil_spv::SPIRVModule::finalize_spirv(&local_1098,&local_1088->spirv);
    if (bVar5) {
      __str = dxil_spv::Converter::get_compiled_entry_point_abi_cxx11_(&local_10a0);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::_M_assign
                (&pdVar4->compiled_entry_point,__str);
      bVar5 = dxil_spv::SPIRVModule::has_builtin_shader_input(&local_1098,BuiltInSubgroupSize);
      pdVar4->uses_subgroup_size = bVar5;
      dxil_spv::Converter::get_workgroup_dimensions
                (&local_10a0,pdVar4->workgroup_size,pdVar4->workgroup_size + 1,
                 pdVar4->workgroup_size + 2);
      dxil_spv::Converter::get_compute_wave_size_range
                (&local_10a0,&pdVar4->wave_size_min,&pdVar4->wave_size_max,
                 &pdVar4->wave_size_preferred);
      uVar6 = dxil_spv::Converter::get_compute_heuristic_max_wave_size(&local_10a0);
      pdVar4->heuristic_wave_size = uVar6;
      uVar6 = dxil_spv::Converter::get_patch_vertex_count(&local_10a0);
      pdVar4->patch_vertex_count = uVar6;
      dVar12 = DXIL_SPV_SUCCESS;
      bVar5 = dxil_spv::Converter::shader_requires_feature(&local_10a0,Native16BitOperations);
      pdVar4->shader_feature_used[0] = bVar5;
      dxil_spv::Converter::get_analysis_warnings_abi_cxx11_((String *)local_1038,&local_10a0);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::operator=
                (&pdVar4->analysis_warnings,(String *)local_1038);
      if ((undefined1 *)CONCAT44(local_1038._4_4_,local_1038._0_4_) != local_1038 + 0x10) {
        dxil_spv::free_in_thread((undefined1 *)CONCAT44(local_1038._4_4_,local_1038._0_4_));
      }
      goto LAB_0010bf73;
    }
    p_Var7 = dxil_spv::get_thread_log_callback();
    if (p_Var7 != (LoggingCallback)0x0) {
      local_1038._16_4_ = 0x5320657a;
      local_1038[0x14] = 'P';
      local_1038._21_6_ = 0xa2e562d5249;
      local_1038[0x1b] = '\0';
      local_1038[0] = 'F';
      local_1038[1] = 'a';
      local_1038[2] = 'i';
      local_1038[3] = 'l';
      local_1038[4] = 'e';
      local_1038[5] = 'd';
      local_1038[6] = ' ';
      local_1038[7] = 't';
      local_1038[8] = 'o';
      local_1038[9] = ' ';
      local_1038[10] = 'f';
      local_1038[0xb] = 'i';
      local_1038[0xc] = 'n';
      local_1038[0xd] = 'a';
      local_1038[0xe] = 'l';
      local_1038[0xf] = 'i';
      goto LAB_0010bf58;
    }
    dxil_spv_converter_run_cold_2();
  }
LAB_0010bf6e:
  dVar12 = DXIL_SPV_ERROR_GENERIC;
LAB_0010bf73:
  if ((_Head_base<0UL,_dxil_spv::CFGNodePool_*,_false>)
      local_1080.node_pool._M_t.
      super___uniq_ptr_impl<dxil_spv::CFGNodePool,_std::default_delete<dxil_spv::CFGNodePool>_>._M_t
      .super__Tuple_impl<0UL,_dxil_spv::CFGNodePool_*,_std::default_delete<dxil_spv::CFGNodePool>_>.
      super__Head_base<0UL,_dxil_spv::CFGNodePool_*,_false>._M_head_impl !=
      (_Head_base<0UL,_dxil_spv::CFGNodePool_*,_false>)0x0) {
    dxil_spv::CFGNodePool::~CFGNodePool
              ((CFGNodePool *)
               local_1080.node_pool._M_t.
               super___uniq_ptr_impl<dxil_spv::CFGNodePool,_std::default_delete<dxil_spv::CFGNodePool>_>
               ._M_t.
               super__Tuple_impl<0UL,_dxil_spv::CFGNodePool_*,_std::default_delete<dxil_spv::CFGNodePool>_>
               .super__Head_base<0UL,_dxil_spv::CFGNodePool_*,_false>._M_head_impl);
    dxil_spv::free_in_thread
              ((void *)local_1080.node_pool._M_t.
                       super___uniq_ptr_impl<dxil_spv::CFGNodePool,_std::default_delete<dxil_spv::CFGNodePool>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_dxil_spv::CFGNodePool_*,_std::default_delete<dxil_spv::CFGNodePool>_>
                       .super__Head_base<0UL,_dxil_spv::CFGNodePool_*,_false>._M_head_impl);
  }
  local_1080.node_pool._M_t.
  super___uniq_ptr_impl<dxil_spv::CFGNodePool,_std::default_delete<dxil_spv::CFGNodePool>_>._M_t.
  super__Tuple_impl<0UL,_dxil_spv::CFGNodePool_*,_std::default_delete<dxil_spv::CFGNodePool>_>.
  super__Head_base<0UL,_dxil_spv::CFGNodePool_*,_false>._M_head_impl =
       (__uniq_ptr_data<dxil_spv::CFGNodePool,_std::default_delete<dxil_spv::CFGNodePool>,_true,_true>
        )(__uniq_ptr_impl<dxil_spv::CFGNodePool,_std::default_delete<dxil_spv::CFGNodePool>_>)0x0;
  if (local_1080.leaf_functions.
      super__Vector_base<dxil_spv::ConvertedFunction::Function,_dxil_spv::ThreadLocalAllocator<dxil_spv::ConvertedFunction::Function>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    dxil_spv::free_in_thread
              (local_1080.leaf_functions.
               super__Vector_base<dxil_spv::ConvertedFunction::Function,_dxil_spv::ThreadLocalAllocator<dxil_spv::ConvertedFunction::Function>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  dxil_spv::Converter::~Converter(&local_10a0);
  dxil_spv::SPIRVModule::~SPIRVModule(&local_1098);
  return dVar12;
}

Assistant:

dxil_spv_result dxil_spv_converter_run(dxil_spv_converter converter)
{
	SPIRVModule module;
	Converter dxil_converter(converter->bc_parser, converter->bc_reflection_parser, module);

	if (!converter->entry_point.empty())
		dxil_converter.set_entry_point(converter->entry_point.c_str());
	dxil_converter.set_resource_remapping_interface(&converter->remapper);
	for (auto &opt : converter->options)
		dxil_converter.add_option(*opt);

	for (auto &local_param : converter->local_root_parameters)
	{
		switch (local_param.type)
		{
		case LocalRootParameterType::Constants:
			dxil_converter.add_local_root_constants(local_param.local_constants.register_space,
			                                        local_param.local_constants.register_index,
			                                        local_param.local_constants.num_words);
			break;

		case LocalRootParameterType::Descriptor:
			dxil_converter.add_local_root_descriptor(local_param.local_descriptor.resource_class,
			                                         local_param.local_descriptor.register_space,
			                                         local_param.local_descriptor.register_index);
			break;

		case LocalRootParameterType::Table:
			dxil_converter.add_local_root_descriptor_table(local_param.table_entries);
			break;
		}
	}

	auto entry_point = dxil_converter.convert_entry_point();

	if (entry_point.entry.entry == nullptr)
	{
		LOGE("Failed to convert function.\n");
		return DXIL_SPV_ERROR_GENERIC;
	}

	{
		dxil_spv::CFGStructurizer structurizer(entry_point.entry.entry, *entry_point.node_pool, module);
		uint32_t driver_id, driver_version;
		if (dxil_converter.get_driver_version(driver_id, driver_version))
			structurizer.set_driver_version(driver_id, driver_version);
		module.set_entry_build_point(entry_point.entry.func);
		structurizer.run();
		module.emit_entry_point_function_body(structurizer);
	}

	for (auto &leaf : entry_point.leaf_functions)
	{
		if (!leaf.entry)
		{
			LOGE("Leaf function is nullptr!\n");
			return DXIL_SPV_ERROR_GENERIC;
		}
		dxil_spv::CFGStructurizer structurizer(leaf.entry, *entry_point.node_pool, module);
		module.set_entry_build_point(leaf.func);
		structurizer.run();
		module.emit_leaf_function_body(leaf.func, structurizer);
	}

	if (!module.finalize_spirv(converter->spirv))
	{
		LOGE("Failed to finalize SPIR-V.\n");
		return DXIL_SPV_ERROR_GENERIC;
	}

	converter->compiled_entry_point = dxil_converter.get_compiled_entry_point();
	converter->uses_subgroup_size = module.has_builtin_shader_input(spv::BuiltInSubgroupSize);
	dxil_converter.get_workgroup_dimensions(converter->workgroup_size[0],
	                                        converter->workgroup_size[1],
	                                        converter->workgroup_size[2]);
	dxil_converter.get_compute_wave_size_range(converter->wave_size_min, converter->wave_size_max, converter->wave_size_preferred);
	converter->heuristic_wave_size = dxil_converter.get_compute_heuristic_max_wave_size();
	converter->patch_vertex_count = dxil_converter.get_patch_vertex_count();
	for (int i = 0; i < int(ShaderFeature::Count); i++)
		converter->shader_feature_used[i] = dxil_converter.shader_requires_feature(ShaderFeature(i));
	converter->analysis_warnings = dxil_converter.get_analysis_warnings();

	return DXIL_SPV_SUCCESS;
}